

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelinePushConstantTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_1::PushConstantGraphicsTestInstance::createShaderStage
          (PushConstantGraphicsTestInstance *this,DeviceInterface *vk,VkDevice device,
          BinaryCollection *programCollection,char *name,VkShaderStageFlagBits stage,
          Move<vk::Handle<(vk::HandleType)14>_> *module)

{
  ProgramBinary *binary;
  VkPipelineShaderStageCreateInfo stageCreateInfo;
  allocator<char> local_a9;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_a8;
  string local_88;
  undefined1 local_68 [24];
  VkShaderModule VStack_50;
  char *local_48;
  VkSpecializationInfo *local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,name,&local_a9);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(programCollection,&local_88);
  ::vk::createShaderModule((Move<vk::Handle<(vk::HandleType)14>_> *)&local_a8,vk,device,binary,0);
  local_68._16_8_ = local_a8.m_data.deleter.m_device;
  VStack_50.m_internal = (deUint64)local_a8.m_data.deleter.m_allocator;
  local_68._0_8_ = local_a8.m_data.object.m_internal;
  local_68._8_8_ = local_a8.m_data.deleter.m_deviceIface;
  local_a8.m_data.object.m_internal = 0;
  local_a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::reset
            (&module->super_RefBase<vk::Handle<(vk::HandleType)14>_>);
  (module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device =
       (VkDevice)local_68._16_8_;
  (module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_50.m_internal;
  (module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal = local_68._0_8_
  ;
  (module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_68._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  local_68._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_68._8_8_ = (void *)0x0;
  local_68._16_8_ = (ulong)stage << 0x20;
  VStack_50.m_internal =
       (module->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  local_48 = "main";
  local_40 = (VkSpecializationInfo *)0x0;
  std::
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::push_back(&this->m_shaderStage,(value_type *)local_68);
  return;
}

Assistant:

void PushConstantGraphicsTestInstance::createShaderStage (const DeviceInterface&	vk,
														  VkDevice					device,
														  const BinaryCollection&	programCollection,
														  const char*				name,
														  VkShaderStageFlagBits		stage,
														  Move<VkShaderModule>*		module)
{
	*module = createShaderModule(vk, device, programCollection.get(name), 0);

	const vk::VkPipelineShaderStageCreateInfo	stageCreateInfo	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		0u,														// VkPipelineShaderStageCreateFlags		flags;
		stage,													// VkShaderStageFlagBits				stage;
		**module,												// VkShaderModule						module;
		"main",													// const char*							pName;
		DE_NULL													// const VkSpecializationInfo*			pSpecializationInfo;
	};

	m_shaderStage.push_back(stageCreateInfo);
}